

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequest.cpp
# Opt level: O2

void __thiscall QNetworkRequest::setOriginatingObject(QNetworkRequest *this,QObject *object)

{
  QNetworkRequestPrivate *pQVar1;
  
  pQVar1 = QSharedDataPointer<QNetworkRequestPrivate>::operator->(&this->d);
  QWeakPointer<QObject>::assign<QObject>
            (&(pQVar1->super_QNetworkHeadersPrivate).originatingObject.wp,object);
  return;
}

Assistant:

void QNetworkRequest::setOriginatingObject(QObject *object)
{
    d->originatingObject = object;
}